

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int cssx(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
        double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
        double *var,double *loglik,double *hess,int start,int imean)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *oup;
  double *oup_00;
  void *__dest;
  double *A;
  double *pdVar5;
  double *pdVar6;
  xlik_css_object object;
  double *col;
  double *dx_00;
  int *ipiv_00;
  int local_114;
  undefined1 local_110 [8];
  custom_function css_min;
  reg_object fit;
  xlik_css_object obj;
  double maxstep;
  int *ipiv;
  double *res;
  double *varcovar;
  double *sigma;
  double *coeff;
  double *SIG;
  double *V;
  double *U;
  double *XX;
  double *x0;
  double *thess;
  double *dx;
  double *inp2;
  double *x;
  double *tf;
  double *b;
  int ERR;
  int orig;
  int rnk;
  int N1;
  int ncxreg;
  int nd;
  int ret;
  int offset;
  int length;
  int retval;
  int pq;
  int i;
  int d_local;
  int p_local;
  int optmethod_local;
  double *xreg_local;
  int N_local;
  double *inp_local;
  
  oup = (double *)malloc((long)(N - s * D) << 3);
  iVar2 = d + D;
  if (xreg == (double *)0x0) {
    local_114 = 0;
  }
  else {
    local_114 = r;
  }
  rnk = local_114;
  if (start == 0) {
    for (retval = 0; retval < p; retval = retval + 1) {
      phi[retval] = 0.0;
    }
    for (retval = 0; retval < q; retval = retval + 1) {
      theta[p + retval] = 0.0;
    }
    for (retval = 0; retval < P; retval = retval + 1) {
      PHI[p + q + retval] = 0.0;
    }
    for (retval = 0; retval < Q; retval = retval + 1) {
      THETA[p + q + P + retval] = 0.0;
    }
  }
  if (D < 1) {
    for (retval = 0; xreg_local._4_4_ = N, retval < N; retval = retval + 1) {
      oup[retval] = inp[retval];
    }
  }
  else {
    xreg_local._4_4_ = diffs(inp,N,D,s,oup);
  }
  oup_00 = (double *)malloc((long)(xreg_local._4_4_ - d) << 3);
  if (d < 1) {
    for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
      oup_00[retval] = oup[retval];
    }
  }
  else {
    xreg_local._4_4_ = diff(oup,xreg_local._4_4_,d,oup_00);
  }
  __dest = malloc((long)N * 8 * (long)(r + 1));
  if ((iVar2 == 0) && (imean == 1)) {
    for (retval = 0; retval < N; retval = retval + 1) {
      *(undefined8 *)((long)__dest + (long)retval * 8) = 0x3ff0000000000000;
    }
    if (0 < r) {
      memcpy((void *)((long)__dest + (long)N * 8),xreg,(long)r * 8 * (long)N);
    }
    rnk = local_114 + 1;
  }
  else if (0 < local_114) {
    memcpy(__dest,xreg,(long)local_114 * 8 * (long)N);
  }
  A = (double *)malloc((long)xreg_local._4_4_ * 8 * (long)(r + 1));
  if (0 < rnk) {
    orig = N;
    if (0 < D) {
      orig = N - s * D;
      for (retval = 0; retval < rnk; retval = retval + 1) {
        diffs((double *)((long)__dest + (long)(N * retval) * 8),N,D,s,A + orig * retval);
        memcpy((void *)((long)__dest + (long)(orig * retval) * 8),A + orig * retval,(long)orig << 3)
        ;
      }
    }
    if (0 < d) {
      for (retval = 0; retval < rnk; retval = retval + 1) {
        diff((double *)((long)__dest + (long)(orig * retval) * 8),orig,d,
             A + xreg_local._4_4_ * retval);
      }
    }
    if (iVar2 == 0) {
      memcpy(A,__dest,(long)xreg_local._4_4_ * 8 * (long)rnk);
    }
    iVar3 = rank(A,xreg_local._4_4_,rnk);
    if (iVar3 < rnk) {
      printf("Exogenous Variables are collinear. \n");
      free(oup);
      free(__dest);
      free(A);
      free(oup_00);
      return 7;
    }
  }
  if (0 < rnk) {
    css_min.params = reg_init(xreg_local._4_4_,rnk);
    pdVar5 = (double *)malloc((long)rnk * 8 * (long)rnk);
    pdVar6 = (double *)malloc((long)xreg_local._4_4_ << 3);
    sigma = (double *)malloc((long)rnk << 3);
    varcovar = (double *)malloc((long)rnk << 3);
    setIntercept((reg_object)css_min.params,0);
    regress((reg_object)css_min.params,A,oup_00,pdVar6,pdVar5,0.95);
    for (retval = 0; retval < rnk; retval = retval + 1) {
      sigma[retval] = *(double *)((long)css_min.params + (long)retval * 0x20 + 0xb0);
      varcovar[retval] = *(double *)((long)css_min.params + (long)retval * 0x20 + 200) * 10.0;
    }
    free(pdVar5);
    free(pdVar6);
    free_reg((reg_object)css_min.params);
  }
  object = xlik_css_init(p,d,q,s,P,D,Q,rnk,xreg_local._4_4_);
  iVar3 = object->pq;
  pdVar5 = (double *)malloc((long)iVar3 << 3);
  pdVar6 = (double *)malloc((long)iVar3 << 3);
  col = (double *)malloc((long)iVar3 * 8 * (long)iVar3);
  dx_00 = (double *)malloc((long)iVar3 << 3);
  ipiv_00 = (int *)malloc((long)iVar3 << 2);
  object->N = xreg_local._4_4_;
  iVar4 = object->offset;
  for (retval = 0; retval < p; retval = retval + 1) {
    pdVar5[retval] = phi[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    pdVar5[p + retval] = -theta[retval];
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    pdVar5[p + q + retval] = PHI[retval];
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    pdVar5[p + q + P + retval] = -THETA[retval];
  }
  if (rnk < 1) {
    object->mean = 0.0;
  }
  else {
    for (retval = 0; retval < rnk; retval = retval + 1) {
      pdVar5[p + q + P + Q + retval] = sigma[retval];
    }
  }
  for (retval = 0; retval < xreg_local._4_4_; retval = retval + 1) {
    dVar1 = oup_00[retval];
    object->x[iVar4 + xreg_local._4_4_ * 2 + retval] = dVar1;
    object->x[iVar4 + retval] = dVar1;
  }
  for (retval = xreg_local._4_4_;
      SBORROW4(retval,xreg_local._4_4_ * 2) != retval + xreg_local._4_4_ * -2 < 0;
      retval = retval + 1) {
    object->x[iVar4 + retval] = 0.0;
  }
  if (0 < rnk) {
    for (retval = xreg_local._4_4_ * 3; retval < (rnk + 3) * xreg_local._4_4_; retval = retval + 1)
    {
      object->x[iVar4 + retval] = A[retval + xreg_local._4_4_ * -3];
    }
  }
  local_110 = (undefined1  [8])fcssx;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)object;
  iVar4 = fminunc((custom_function *)local_110,(custom_gradient *)0x0,iVar3,pdVar5,1.0,optmethod,
                  pdVar6);
  if (iVar4 == 0) {
    ncxreg = 0;
  }
  else if (iVar4 == 0xf) {
    ncxreg = 0xf;
  }
  else if (iVar4 == 4) {
    ncxreg = 4;
  }
  else {
    ncxreg = 1;
  }
  for (retval = 0; retval < iVar3 - rnk; retval = retval + 1) {
    dx_00[retval] = 1.0;
  }
  for (retval = 0; retval < rnk; retval = retval + 1) {
    dx_00[(iVar3 - rnk) + retval] = varcovar[retval];
  }
  hessian_fd((custom_function *)local_110,pdVar6,iVar3,dx_00,object->eps,hess);
  mtranspose(hess,iVar3,iVar3,col);
  for (retval = 0; retval < iVar3 * iVar3; retval = retval + 1) {
    col[retval] = (double)((xreg_local._4_4_ - d) - s * D) * 0.5 * (hess[retval] + col[retval]);
  }
  ludecomp(col,iVar3,ipiv_00);
  minverse(col,iVar3,ipiv_00,hess);
  for (retval = 0; retval < p; retval = retval + 1) {
    phi[retval] = pdVar6[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    theta[retval] = -pdVar6[p + retval];
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    PHI[retval] = pdVar6[p + q + retval];
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    THETA[retval] = -pdVar6[p + q + P + retval];
  }
  if ((iVar2 == 0) && (imean == 1)) {
    *wmean = pdVar6[p + q + Q + P];
    if (1 < rnk) {
      for (retval = 1; retval < rnk; retval = retval + 1) {
        exog[retval + -1] = pdVar6[p + q + Q + P + retval];
      }
    }
  }
  else {
    *wmean = 0.0;
    for (retval = 0; retval < rnk; retval = retval + 1) {
      exog[retval] = pdVar6[p + q + Q + P + retval];
    }
  }
  *var = object->ssq / (double)object->Nmncond;
  *loglik = object->loglik;
  free(pdVar5);
  free(pdVar6);
  free(oup);
  free(__dest);
  free(A);
  free(oup_00);
  free(col);
  free(dx_00);
  free(ipiv_00);
  if (0 < rnk) {
    free(sigma);
    free(varcovar);
  }
  free_xlik_css(object);
  return ncxreg;
}

Assistant:

int cssx(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA,  double *exog, int r, double *wmean, double *var,double *loglik,double *hess,int start,int imean) {
	int i, pq, retval, length, offset,ret,nd,ncxreg,N1,rnk,orig,ERR;
	double *b, *tf, *x, *inp2,*dx,*thess,*x0,*XX,*U,*V,*SIG,*coeff,*sigma,*varcovar,*res;
	int *ipiv;
	double maxstep;
	xlik_css_object obj;
	reg_object fit;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	nd = d + D;
	ncxreg = (xreg == NULL) ? 0 : r;

	maxstep = 1.0;

	if (start == 0) {
		for (i = 0; i < p; ++i) {
			phi[i] = 0.0;
		}
		for (i = 0; i < q; ++i) {
			theta[p + i] = 0.0;
		}
		for (i = 0; i < P; ++i) {
			PHI[p + q + i] = 0.0;
		}
		for (i = 0; i < Q; ++i) {
			THETA[p + q + P + i] = 0.0;
		}
	}

	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);


		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
		}


		free(varcovar);
		free(res);
		free_reg(fit);
	}


	obj = xlik_css_init(p, d, q, s, P, D, Q, ncxreg, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	} else {
		obj->mean = 0.0;
	}

	

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}

	custom_function css_min = { fcssx, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}
	
	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}
	

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double) obj->Nmncond;
	//*var = (obj->ssq) / (double) N;
	*loglik = obj->loglik;
	
	free(b);
	free(tf);
	free(inp2);
	free(x0);
	free(XX); 
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	free_xlik_css(obj);
	return ret;
}